

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.h
# Opt level: O0

void __thiscall
r_exec::SaliencyPropagationJob::~SaliencyPropagationJob(SaliencyPropagationJob *this)

{
  SaliencyPropagationJob *this_local;
  
  ~SaliencyPropagationJob(this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT SaliencyPropagationJob:
    public TimeJob
{
public:
    core::P<r_code::Code> object;
    double sln_change;
    double source_sln_thr;
    SaliencyPropagationJob(r_code::Code *o, double sln_change, double source_sln_thr, uint64_t ijt);
    bool update();
    void report(int64_t lag) const;
}